

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O2

void __thiscall irr::core::CMatrix4<float>::getTransposed(CMatrix4<float> *this,CMatrix4<float> *o)

{
  o->M[0] = this->M[0];
  o->M[1] = this->M[4];
  o->M[2] = this->M[8];
  o->M[3] = this->M[0xc];
  o->M[4] = this->M[1];
  o->M[5] = this->M[5];
  o->M[6] = this->M[9];
  o->M[7] = this->M[0xd];
  o->M[8] = this->M[2];
  o->M[9] = this->M[6];
  o->M[10] = this->M[10];
  o->M[0xb] = this->M[0xe];
  o->M[0xc] = this->M[3];
  o->M[0xd] = this->M[7];
  o->M[0xe] = this->M[0xb];
  o->M[0xf] = this->M[0xf];
  return;
}

Assistant:

inline void CMatrix4<T>::getTransposed(CMatrix4<T> &o) const
{
	o[0] = M[0];
	o[1] = M[4];
	o[2] = M[8];
	o[3] = M[12];

	o[4] = M[1];
	o[5] = M[5];
	o[6] = M[9];
	o[7] = M[13];

	o[8] = M[2];
	o[9] = M[6];
	o[10] = M[10];
	o[11] = M[14];

	o[12] = M[3];
	o[13] = M[7];
	o[14] = M[11];
	o[15] = M[15];
#if defined(USE_MATRIX_TEST)
	o.definitelyIdentityMatrix = definitelyIdentityMatrix;
#endif
}